

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

TRANSPORT_HANDLE
IoTHubTransport_Create
          (IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol,char *iotHubName,char *iotHubSuffix)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  TRANSPORT_PROVIDER *pTVar3;
  TRANSPORT_LL_HANDLE pvVar4;
  LOCK_HANDLE pvVar5;
  VECTOR_HANDLE pVVar6;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  IOTHUBTRANSPORT_CONFIG transportLLConfig;
  IOTHUB_CLIENT_CONFIG upperConfig;
  TRANSPORT_PROVIDER *transportProtocol;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TRANSPORT_CALLBACKS_INFO transport_cb;
  TRANSPORT_HANDLE_DATA *result;
  char *iotHubSuffix_local;
  char *iotHubName_local;
  IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol_local;
  
  if (((protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) || (iotHubName == (char *)0x0)) ||
     (iotHubSuffix == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"IoTHubTransport_Create",0x2c,1,
                "Invalid NULL argument, protocol [%p], name [%p], suffix [%p].",protocol,iotHubName,
                iotHubSuffix);
    }
    transport_cb.get_model_id_cb = (pfTransport_GetOption_Model_Id_Callback)0x0;
  }
  else {
    iVar1 = IoTHubClientCore_LL_GetTransportCallbacks((TRANSPORT_CALLBACKS_INFO *)&l);
    if (iVar1 == 0) {
      transport_cb.get_model_id_cb = (pfTransport_GetOption_Model_Id_Callback)malloc(0xf0);
      if (transport_cb.get_model_id_cb == (pfTransport_GetOption_Model_Id_Callback)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                    ,"IoTHubTransport_Create",0x39,1,"Transport handle was not allocated.");
        }
      }
      else {
        pTVar3 = (*protocol)();
        transportLLConfig.moduleId = (char *)protocol;
        memset(&l_3,0,0x20);
        l_3 = (LOGGER_LOG)&transportLLConfig.moduleId;
        transportLLConfig.upperConfig = (IOTHUB_CLIENT_CONFIG *)0x0;
        pvVar4 = (*pTVar3->IoTHubTransport_Create)
                           ((IOTHUBTRANSPORT_CONFIG *)&l_3,(TRANSPORT_CALLBACKS_INFO *)&l,
                            (void *)0x0);
        *(TRANSPORT_LL_HANDLE *)transport_cb.get_model_id_cb = pvVar4;
        if (*(long *)transport_cb.get_model_id_cb == 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                      ,"IoTHubTransport_Create",0x4e,1,"Lower Layer transport not created.");
          }
          free(transport_cb.get_model_id_cb);
          transport_cb.get_model_id_cb = (pfTransport_GetOption_Model_Id_Callback)0x0;
        }
        else {
          pvVar5 = Lock_Init();
          *(LOCK_HANDLE *)(transport_cb.get_model_id_cb + 0x10) = pvVar5;
          if (*(long *)(transport_cb.get_model_id_cb + 0x10) == 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                        ,"IoTHubTransport_Create",0x57,1,"transport Lock not created.");
            }
            (*pTVar3->IoTHubTransport_Destroy)(*(TRANSPORT_LL_HANDLE *)transport_cb.get_model_id_cb)
            ;
            free(transport_cb.get_model_id_cb);
            transport_cb.get_model_id_cb = (pfTransport_GetOption_Model_Id_Callback)0x0;
          }
          else {
            pvVar5 = Lock_Init();
            *(LOCK_HANDLE *)(transport_cb.get_model_id_cb + 0xe0) = pvVar5;
            if (pvVar5 == (LOCK_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                          ,"IoTHubTransport_Create",0x5e,1,"clients Lock not created.");
              }
              Lock_Deinit(*(LOCK_HANDLE *)(transport_cb.get_model_id_cb + 0x10));
              (*pTVar3->IoTHubTransport_Destroy)
                        (*(TRANSPORT_LL_HANDLE *)transport_cb.get_model_id_cb);
              free(transport_cb.get_model_id_cb);
              transport_cb.get_model_id_cb = (pfTransport_GetOption_Model_Id_Callback)0x0;
            }
            else {
              pVVar6 = VECTOR_create(8);
              *(VECTOR_HANDLE *)(transport_cb.get_model_id_cb + 0xd8) = pVVar6;
              if (*(long *)(transport_cb.get_model_id_cb + 0xd8) == 0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                            ,"IoTHubTransport_Create",0x69,1,"clients list not created.");
                }
                Lock_Deinit(*(LOCK_HANDLE *)(transport_cb.get_model_id_cb + 0xe0));
                Lock_Deinit(*(LOCK_HANDLE *)(transport_cb.get_model_id_cb + 0x10));
                (*pTVar3->IoTHubTransport_Destroy)
                          (*(TRANSPORT_LL_HANDLE *)transport_cb.get_model_id_cb);
                free(transport_cb.get_model_id_cb);
                transport_cb.get_model_id_cb = (pfTransport_GetOption_Model_Id_Callback)0x0;
              }
              else {
                *(undefined4 *)(transport_cb.get_model_id_cb + 0x18) = 1;
                *(undefined8 *)(transport_cb.get_model_id_cb + 0xe8) = 0;
                *(undefined8 *)(transport_cb.get_model_id_cb + 8) = 0;
                *(pfIoTHubTransport_GetHostname *)(transport_cb.get_model_id_cb + 0x58) =
                     pTVar3->IoTHubTransport_GetHostname;
                *(pfIoTHubTransport_SetOption *)(transport_cb.get_model_id_cb + 0x60) =
                     pTVar3->IoTHubTransport_SetOption;
                *(pfIoTHubTransport_Create *)(transport_cb.get_model_id_cb + 0x68) =
                     pTVar3->IoTHubTransport_Create;
                *(pfIoTHubTransport_Destroy *)(transport_cb.get_model_id_cb + 0x70) =
                     pTVar3->IoTHubTransport_Destroy;
                *(pfIotHubTransport_Register *)(transport_cb.get_model_id_cb + 0x78) =
                     pTVar3->IoTHubTransport_Register;
                *(pfIotHubTransport_Unregister *)(transport_cb.get_model_id_cb + 0x80) =
                     pTVar3->IoTHubTransport_Unregister;
                *(pfIoTHubTransport_Subscribe *)(transport_cb.get_model_id_cb + 0x88) =
                     pTVar3->IoTHubTransport_Subscribe;
                *(pfIoTHubTransport_Unsubscribe *)(transport_cb.get_model_id_cb + 0x90) =
                     pTVar3->IoTHubTransport_Unsubscribe;
                *(pfIoTHubTransport_DoWork *)(transport_cb.get_model_id_cb + 0x98) =
                     pTVar3->IoTHubTransport_DoWork;
                *(pfIoTHubTransport_SetRetryPolicy *)(transport_cb.get_model_id_cb + 0xa0) =
                     pTVar3->IoTHubTransport_SetRetryPolicy;
                *(pfIoTHubTransport_GetSendStatus *)(transport_cb.get_model_id_cb + 0xa8) =
                     pTVar3->IoTHubTransport_GetSendStatus;
              }
            }
          }
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                  ,"IoTHubTransport_Create",0x31,1,"Failure getting transport callbacks");
      }
      transport_cb.get_model_id_cb = (pfTransport_GetOption_Model_Id_Callback)0x0;
    }
  }
  return (TRANSPORT_HANDLE)transport_cb.get_model_id_cb;
}

Assistant:

TRANSPORT_HANDLE IoTHubTransport_Create(IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol, const char* iotHubName, const char* iotHubSuffix)
{
    TRANSPORT_HANDLE_DATA *result;
    TRANSPORT_CALLBACKS_INFO transport_cb;

    if (protocol == NULL || iotHubName == NULL || iotHubSuffix == NULL)
    {
        LogError("Invalid NULL argument, protocol [%p], name [%p], suffix [%p].", protocol, iotHubName, iotHubSuffix);
        result = NULL;
    }
    else if (IoTHubClientCore_LL_GetTransportCallbacks(&transport_cb) != 0)
    {
        LogError("Failure getting transport callbacks");
        result = NULL;
    }
    else
    {
        result = (TRANSPORT_HANDLE_DATA*)malloc(sizeof(TRANSPORT_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("Transport handle was not allocated.");
        }
        else
        {
            TRANSPORT_PROVIDER * transportProtocol = (TRANSPORT_PROVIDER*)(protocol());
            IOTHUB_CLIENT_CONFIG upperConfig;
            upperConfig.deviceId = NULL;
            upperConfig.deviceKey = NULL;
            upperConfig.iotHubName = iotHubName;
            upperConfig.iotHubSuffix = iotHubSuffix;
            upperConfig.protocol = protocol;
            upperConfig.protocolGatewayHostName = NULL;

            IOTHUBTRANSPORT_CONFIG transportLLConfig;
            memset(&transportLLConfig, 0, sizeof(IOTHUBTRANSPORT_CONFIG));
            transportLLConfig.upperConfig = &upperConfig;
            transportLLConfig.waitingToSend = NULL;

            result->transportLLHandle = transportProtocol->IoTHubTransport_Create(&transportLLConfig, &transport_cb, NULL);
            if (result->transportLLHandle == NULL)
            {
                LogError("Lower Layer transport not created.");
                free(result);
                result = NULL;
            }
            else
            {
                result->lockHandle = Lock_Init();
                if (result->lockHandle == NULL)
                {
                    LogError("transport Lock not created.");
                    transportProtocol->IoTHubTransport_Destroy(result->transportLLHandle);
                    free(result);
                    result = NULL;
                }
                else if ((result->clientsLockHandle = Lock_Init()) == NULL)
                {
                    LogError("clients Lock not created.");
                    Lock_Deinit(result->lockHandle);
                    transportProtocol->IoTHubTransport_Destroy(result->transportLLHandle);
                    free(result);
                    result = NULL;
                }
                else
                {
                    result->clients = VECTOR_create(sizeof(IOTHUB_CLIENT_CORE_HANDLE));
                    if (result->clients == NULL)
                    {
                        LogError("clients list not created.");
                        Lock_Deinit(result->clientsLockHandle);
                        Lock_Deinit(result->lockHandle);
                        transportProtocol->IoTHubTransport_Destroy(result->transportLLHandle);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        result->stopThread = 1;
                        result->clientDoWork = NULL;
                        result->workerThreadHandle = NULL; /* create thread when work needs to be done */
                        result->IoTHubTransport_GetHostname = transportProtocol->IoTHubTransport_GetHostname;
                        result->IoTHubTransport_SetOption = transportProtocol->IoTHubTransport_SetOption;
                        result->IoTHubTransport_Create = transportProtocol->IoTHubTransport_Create;
                        result->IoTHubTransport_Destroy = transportProtocol->IoTHubTransport_Destroy;
                        result->IoTHubTransport_Register = transportProtocol->IoTHubTransport_Register;
                        result->IoTHubTransport_Unregister = transportProtocol->IoTHubTransport_Unregister;
                        result->IoTHubTransport_Subscribe = transportProtocol->IoTHubTransport_Subscribe;
                        result->IoTHubTransport_Unsubscribe = transportProtocol->IoTHubTransport_Unsubscribe;
                        result->IoTHubTransport_DoWork = transportProtocol->IoTHubTransport_DoWork;
                        result->IoTHubTransport_SetRetryPolicy = transportProtocol->IoTHubTransport_SetRetryPolicy;
                        result->IoTHubTransport_GetSendStatus = transportProtocol->IoTHubTransport_GetSendStatus;
                    }
                }
            }
        }
    }

    return result;
}